

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidgload.c
# Opt level: O3

FT_Error cid_slot_load_glyph(FT_GlyphSlot cidglyph,FT_Size cidsize,FT_UInt glyph_index,
                            FT_Int32 load_flags)

{
  FT_Pos *pFVar1;
  byte *pbVar2;
  FT_Outline *outline;
  char cVar3;
  char cVar4;
  FT_Face pFVar5;
  FT_Slot_Internal pFVar6;
  uint uVar7;
  FT_GlyphSlot pFVar8;
  int iVar9;
  FT_Fixed FVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  FT_Vector *pFVar14;
  long lVar15;
  bool bVar16;
  FT_Matrix font_matrix;
  FT_BBox cbox;
  T1_DecoderRec decoder;
  
  pFVar5 = cidglyph->face;
  iVar9 = 6;
  if (glyph_index < (uint)pFVar5->num_glyphs) {
    lVar11 = pFVar5[1].face_index;
    uVar7 = load_flags | 3;
    if (((uint)load_flags >> 10 & 1) == 0) {
      uVar7 = load_flags;
    }
    pFVar8 = (FT_GlyphSlot)(cidsize->metrics).y_scale;
    cidglyph[1].face = (FT_Face)(cidsize->metrics).x_scale;
    cidglyph[1].next = pFVar8;
    (cidglyph->outline).n_contours = 0;
    (cidglyph->outline).n_points = 0;
    bVar16 = (uVar7 & 3) == 0;
    *(bool *)&cidglyph[1].library = bVar16;
    *(byte *)((long)&cidglyph[1].library + 1) = (byte)(uVar7 & 1) ^ 1;
    cidglyph->format = FT_GLYPH_FORMAT_OUTLINE;
    iVar9 = (*(code *)**(undefined8 **)(lVar11 + 0x18))
                      (&decoder,pFVar5,cidsize,cidglyph,0,0,bVar16,uVar7 >> 0x10 & 0xf,
                       cid_load_glyph);
    if (iVar9 == 0) {
      decoder.builder.no_recurse = (FT_Bool)((uVar7 & 0x400) >> 10);
      iVar9 = cid_load_glyph(&decoder,glyph_index);
      if (iVar9 == 0) {
        cVar3 = *(char *)&cidglyph[1].library;
        cVar4 = *(char *)((long)&cidglyph[1].library + 1);
        font_matrix.yx = decoder.font_matrix.yx;
        font_matrix.yy = decoder.font_matrix.yy;
        font_matrix.xx = decoder.font_matrix.xx;
        font_matrix.xy = decoder.font_matrix.xy;
        (**(code **)(*(long *)(lVar11 + 0x18) + 8))();
        (cidglyph->outline).flags = (cidglyph->outline).flags & 1U | 4;
        if ((uVar7 & 0x400) == 0) {
          FVar10 = FT_RoundFix(decoder.builder.advance.x);
          (cidglyph->metrics).horiAdvance = FVar10 >> 0x10;
          FVar10 = FT_RoundFix(decoder.builder.advance.x);
          cidglyph->linearHoriAdvance = FVar10 >> 0x10;
          cidglyph->internal->glyph_transformed = '\0';
          lVar11 = *(long *)&pFVar5[1].max_advance_width - pFVar5[1].bbox.yMax >> 0x10;
          (cidglyph->metrics).vertAdvance = lVar11;
          cidglyph->linearVertAdvance = lVar11;
          cidglyph->format = FT_GLYPH_FORMAT_OUTLINE;
          if ((cidsize->metrics).y_ppem < 0x18) {
            pbVar2 = (byte *)((long)&(cidglyph->outline).flags + 1);
            *pbVar2 = *pbVar2 | 1;
          }
          outline = &cidglyph->outline;
          if ((((font_matrix.xx != 0x10000) || (font_matrix.yy != 0x10000)) || (font_matrix.xy != 0)
              ) || (font_matrix.yx != 0)) {
            FT_Outline_Transform(outline,&font_matrix);
            lVar11 = (long)(int)font_matrix.xx * (long)(int)(cidglyph->metrics).horiAdvance;
            (cidglyph->metrics).horiAdvance =
                 (long)(int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
            lVar11 = (long)(int)font_matrix.yy * (long)(int)(cidglyph->metrics).vertAdvance;
            lVar11 = (long)(int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
            (cidglyph->metrics).vertAdvance = lVar11;
          }
          if (decoder.font_offset.x != 0 || decoder.font_offset.y != 0) {
            FT_Outline_Translate(outline,decoder.font_offset.x,decoder.font_offset.y);
            pFVar1 = &(cidglyph->metrics).horiAdvance;
            *pFVar1 = *pFVar1 + decoder.font_offset.x;
            lVar11 = decoder.font_offset.y + (cidglyph->metrics).vertAdvance;
            (cidglyph->metrics).vertAdvance = lVar11;
          }
          if (((uVar7 & 1) == 0) || (cVar4 != '\0')) {
            iVar12 = (int)cidglyph[1].face;
            iVar9 = (int)cidglyph[1].next;
            if ((cVar3 == '\0') || (decoder.builder.hints_funcs == (void *)0x0)) {
              if (0 < (decoder.builder.base)->n_points) {
                pFVar14 = (decoder.builder.base)->points;
                uVar13 = (int)(decoder.builder.base)->n_points + 1;
                do {
                  lVar15 = (long)(int)pFVar14->x * (long)iVar12;
                  pFVar14->x = (long)(int)((ulong)(lVar15 + 0x8000 + (lVar15 >> 0x3f)) >> 0x10);
                  lVar15 = (long)(int)pFVar14->y * (long)iVar9;
                  pFVar14->y = (long)(int)((ulong)(lVar15 + 0x8000 + (lVar15 >> 0x3f)) >> 0x10);
                  pFVar14 = pFVar14 + 1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
            }
            lVar15 = (long)iVar12 * (long)(int)(cidglyph->metrics).horiAdvance;
            (cidglyph->metrics).horiAdvance =
                 (long)(int)((ulong)(lVar15 + 0x8000 + (lVar15 >> 0x3f)) >> 0x10);
            lVar11 = (long)iVar9 * (long)(int)lVar11;
            (cidglyph->metrics).vertAdvance =
                 (long)(int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
          }
          FT_Outline_Get_CBox(outline,&cbox);
          (cidglyph->metrics).width = cbox.xMax - cbox.xMin;
          (cidglyph->metrics).height = cbox.yMax - cbox.yMin;
          (cidglyph->metrics).horiBearingX = cbox.xMin;
          (cidglyph->metrics).horiBearingY = cbox.yMax;
          if ((uVar7 & 0x10) != 0) {
            ft_synthesize_vertical_metrics(&cidglyph->metrics,(cidglyph->metrics).vertAdvance);
          }
        }
        else {
          pFVar6 = cidglyph->internal;
          FVar10 = FT_RoundFix(decoder.builder.left_bearing.x);
          (cidglyph->metrics).horiBearingX = FVar10 >> 0x10;
          FVar10 = FT_RoundFix(decoder.builder.advance.x);
          (cidglyph->metrics).horiAdvance = FVar10 >> 0x10;
          (pFVar6->glyph_matrix).xx = font_matrix.xx;
          (pFVar6->glyph_matrix).xy = font_matrix.xy;
          (pFVar6->glyph_matrix).yx = font_matrix.yx;
          (pFVar6->glyph_matrix).yy = font_matrix.yy;
          (pFVar6->glyph_delta).x = decoder.font_offset.x;
          (pFVar6->glyph_delta).y = decoder.font_offset.y;
          pFVar6->glyph_transformed = '\x01';
        }
        iVar9 = 0;
      }
      else {
        (**(code **)(*(long *)(lVar11 + 0x18) + 8))(&decoder);
      }
    }
  }
  return iVar9;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cid_slot_load_glyph( FT_GlyphSlot  cidglyph,      /* CID_GlyphSlot */
                       FT_Size       cidsize,       /* CID_Size      */
                       FT_UInt       glyph_index,
                       FT_Int32      load_flags )
  {
    CID_GlyphSlot  glyph = (CID_GlyphSlot)cidglyph;
    FT_Error       error;
    T1_DecoderRec  decoder;
    CID_Face       face = (CID_Face)cidglyph->face;
    FT_Bool        hinting;
    FT_Bool        scaled;

    PSAux_Service  psaux = (PSAux_Service)face->psaux;
    FT_Matrix      font_matrix;
    FT_Vector      font_offset;
    FT_Bool        must_finish_decoder = FALSE;


    if ( glyph_index >= (FT_UInt)face->root.num_glyphs )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE | FT_LOAD_NO_HINTING;

    glyph->x_scale = cidsize->metrics.x_scale;
    glyph->y_scale = cidsize->metrics.y_scale;

    cidglyph->outline.n_points   = 0;
    cidglyph->outline.n_contours = 0;

    hinting = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 &&
                       ( load_flags & FT_LOAD_NO_HINTING ) == 0 );
    scaled  = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 );

    glyph->hint      = hinting;
    glyph->scaled    = scaled;
    cidglyph->format = FT_GLYPH_FORMAT_OUTLINE;

    error = psaux->t1_decoder_funcs->init( &decoder,
                                           cidglyph->face,
                                           cidsize,
                                           cidglyph,
                                           0, /* glyph names -- XXX */
                                           0, /* blend == 0 */
                                           hinting,
                                           FT_LOAD_TARGET_MODE( load_flags ),
                                           cid_load_glyph );
    if ( error )
      goto Exit;

    /* TODO: initialize decoder.len_buildchar and decoder.buildchar */
    /*       if we ever support CID-keyed multiple master fonts     */

    must_finish_decoder = TRUE;

    /* set up the decoder */
    decoder.builder.no_recurse = FT_BOOL( load_flags & FT_LOAD_NO_RECURSE );

    error = cid_load_glyph( &decoder, glyph_index );
    if ( error )
      goto Exit;

    /* copy flags back for forced scaling */
    hinting = glyph->hint;
    scaled  = glyph->scaled;

    font_matrix = decoder.font_matrix;
    font_offset = decoder.font_offset;

    /* save new glyph tables */
    psaux->t1_decoder_funcs->done( &decoder );

    must_finish_decoder = FALSE;

    /* now set the metrics -- this is rather simple, as    */
    /* the left side bearing is the xMin, and the top side */
    /* bearing the yMax                                    */
    cidglyph->outline.flags &= FT_OUTLINE_OWNER;
    cidglyph->outline.flags |= FT_OUTLINE_REVERSE_FILL;

    /* for composite glyphs, return only left side bearing and */
    /* advance width                                           */
    if ( load_flags & FT_LOAD_NO_RECURSE )
    {
      FT_Slot_Internal  internal = cidglyph->internal;


      cidglyph->metrics.horiBearingX =
        FIXED_TO_INT( decoder.builder.left_bearing.x );
      cidglyph->metrics.horiAdvance =
        FIXED_TO_INT( decoder.builder.advance.x );

      internal->glyph_matrix      = font_matrix;
      internal->glyph_delta       = font_offset;
      internal->glyph_transformed = 1;
    }
    else
    {
      FT_BBox            cbox;
      FT_Glyph_Metrics*  metrics = &cidglyph->metrics;


      /* copy the _unscaled_ advance width */
      metrics->horiAdvance =
        FIXED_TO_INT( decoder.builder.advance.x );
      cidglyph->linearHoriAdvance =
        FIXED_TO_INT( decoder.builder.advance.x );
      cidglyph->internal->glyph_transformed = 0;

      /* make up vertical ones */
      metrics->vertAdvance        = ( face->cid.font_bbox.yMax -
                                      face->cid.font_bbox.yMin ) >> 16;
      cidglyph->linearVertAdvance = metrics->vertAdvance;

      cidglyph->format            = FT_GLYPH_FORMAT_OUTLINE;

      if ( cidsize->metrics.y_ppem < 24 )
        cidglyph->outline.flags |= FT_OUTLINE_HIGH_PRECISION;

      /* apply the font matrix, if any */
      if ( font_matrix.xx != 0x10000L || font_matrix.yy != 0x10000L ||
           font_matrix.xy != 0        || font_matrix.yx != 0        )
      {
        FT_Outline_Transform( &cidglyph->outline, &font_matrix );

        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance,
                                          font_matrix.xx );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance,
                                          font_matrix.yy );
      }

      if ( font_offset.x || font_offset.y )
      {
        FT_Outline_Translate( &cidglyph->outline,
                              font_offset.x,
                              font_offset.y );

        metrics->horiAdvance += font_offset.x;
        metrics->vertAdvance += font_offset.y;
      }

      if ( ( load_flags & FT_LOAD_NO_SCALE ) == 0 || scaled )
      {
        /* scale the outline and the metrics */
        FT_Int       n;
        FT_Outline*  cur = decoder.builder.base;
        FT_Vector*   vec = cur->points;
        FT_Fixed     x_scale = glyph->x_scale;
        FT_Fixed     y_scale = glyph->y_scale;


        /* First of all, scale the points */
        if ( !hinting || !decoder.builder.hints_funcs )
          for ( n = cur->n_points; n > 0; n--, vec++ )
          {
            vec->x = FT_MulFix( vec->x, x_scale );
            vec->y = FT_MulFix( vec->y, y_scale );
          }

        /* Then scale the metrics */
        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
      }

      /* compute the other metrics */
      FT_Outline_Get_CBox( &cidglyph->outline, &cbox );

      metrics->width  = cbox.xMax - cbox.xMin;
      metrics->height = cbox.yMax - cbox.yMin;

      metrics->horiBearingX = cbox.xMin;
      metrics->horiBearingY = cbox.yMax;

      if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
      {
        /* make up vertical ones */
        ft_synthesize_vertical_metrics( metrics,
                                        metrics->vertAdvance );
      }
    }

  Exit:

    if ( must_finish_decoder )
      psaux->t1_decoder_funcs->done( &decoder );

    return error;
  }